

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_SplitTxOut_Test::TestBody(cfdcapi_transaction_SplitTxOut_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  char *str_buffer;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_7;
  char *tx_hex;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_2;
  void *split_handle;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *tx_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *in_stack_00000720;
  char *in_stack_00000728;
  char *in_stack_00000730;
  int64_t in_stack_00000738;
  void *in_stack_00000740;
  void *in_stack_00000748;
  bool *in_stack_fffffffffffffb28;
  AssertionResult *in_stack_fffffffffffffb30;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  char *in_stack_fffffffffffffb40;
  AssertionResult *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  char *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbf0;
  char *in_stack_fffffffffffffbf8;
  AssertionResult *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffc70;
  uint32_t in_stack_fffffffffffffca4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  void *in_stack_fffffffffffffcb8;
  AssertHelper local_338;
  Message local_330;
  AssertionResult local_328;
  AssertHelper local_318;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  int in_stack_fffffffffffffd04;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd08;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined4 local_2d4;
  AssertionResult local_2d0;
  AssertHelper local_2c0;
  Message local_2b8;
  AssertionResult local_2b0;
  string local_2a0;
  AssertHelper local_280;
  Message local_278;
  undefined1 local_269;
  AssertionResult local_268;
  AssertHelper local_258;
  Message local_250;
  undefined4 local_244;
  AssertionResult local_240;
  char *local_230;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  AssertionResult local_1c0;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined4 local_19c;
  AssertionResult local_198;
  string local_188;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_151;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_12c;
  AssertionResult local_128;
  long local_118;
  string local_110;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_d9;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  long local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)in_stack_fffffffffffffb48);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
             (int *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c6b3a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x366,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3c6b9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c6bf2);
  local_61 = local_10 != 0;
  pAVar4 = &local_60;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(type *)0x3c6c26);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(nullptr == handle)","true",
               "false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x367,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3c6d22);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c6d9d);
  local_a0 = 0;
  local_14 = CfdInitializeTxDataHandle
                       (in_stack_fffffffffffffd08.ptr_,in_stack_fffffffffffffd04,
                        (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                        (void **)in_stack_fffffffffffffcf0.ptr_);
  local_b4 = 0;
  this_00 = &local_b0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
             (int *)in_stack_fffffffffffffb30);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c6e7b);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x36c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3c6ede);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c6f33);
  local_d9 = local_a0 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(type *)0x3c6f67);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_d8,(AssertionResult *)"(nullptr == tx_handle)","true",
               "false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x36d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message((Message *)0x3c7063);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c70de);
  if (local_14 == 0) {
    local_118 = 0;
    local_14 = CfdCreateSplitTxOutHandle
                         (pAVar4,(void *)CONCAT17(uVar2,in_stack_fffffffffffffc70),(void **)this_00)
    ;
    local_12c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               (int *)in_stack_fffffffffffffb30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c71c9);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x371,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message((Message *)0x3c722c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c7281);
    local_151 = local_118 != 0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(type *)0x3c72b5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_188,(internal *)&local_150,(AssertionResult *)"(nullptr == split_handle)",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x372,pcVar3);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      testing::Message::~Message((Message *)0x3c73b1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c742c);
    if (local_14 == 0) {
      local_14 = CfdAddSplitTxOutData
                           (in_stack_00000748,in_stack_00000740,in_stack_00000738,in_stack_00000730,
                            in_stack_00000728,in_stack_00000720);
      local_19c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
                 (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int *)in_stack_fffffffffffffb30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c7519);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x376,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        testing::Message::~Message((Message *)0x3c757c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c75d4);
      in_R9 = "";
      local_14 = CfdAddSplitTxOutData
                           (in_stack_00000748,in_stack_00000740,in_stack_00000738,in_stack_00000730,
                            in_stack_00000728,in_stack_00000720);
      local_1c4 = 0;
      in_stack_fffffffffffffc00 = &local_1c0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
                 (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int *)in_stack_fffffffffffffb30);
      in_stack_fffffffffffffc0f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc00);
      if (!(bool)in_stack_fffffffffffffc0f) {
        testing::Message::Message(&local_1d0);
        in_stack_fffffffffffffbf8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3c76b3);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x379,in_stack_fffffffffffffbf8);
        testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_1d8);
        testing::Message::~Message((Message *)0x3c7716);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c776e);
      local_14 = CfdSplitTxOut(in_stack_fffffffffffffcb8,
                               (void *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                               ,in_stack_fffffffffffffca8.ptr_,in_stack_fffffffffffffca4);
      local_1ec = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
                 (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int *)in_stack_fffffffffffffb30);
      uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
      if (!(bool)uVar2) {
        testing::Message::Message(&local_1f8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c7844);
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x37c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        testing::Message::~Message((Message *)0x3c78a7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c78ff);
      local_14 = CfdFreeSplitTxOutHandle
                           (in_stack_fffffffffffffbf8,
                            (void *)CONCAT17(uVar2,in_stack_fffffffffffffbf0));
      local_214 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
                 (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int *)in_stack_fffffffffffffb30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
      if (!bVar1) {
        testing::Message::Message(&local_220);
        in_stack_fffffffffffffbc8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3c79c8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_228,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x37f,in_stack_fffffffffffffbc8);
        testing::internal::AssertHelper::operator=(&local_228,&local_220);
        testing::internal::AssertHelper::~AssertHelper(&local_228);
        testing::Message::~Message((Message *)0x3c7a2b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c7a80);
    }
    local_230 = (char *)0x0;
    local_14 = CfdFinalizeTransaction
                         (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(char **)0x3c7abd);
    local_244 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               (int *)in_stack_fffffffffffffb30);
    in_stack_fffffffffffffbc7 = testing::AssertionResult::operator_cast_to_bool(&local_240);
    if (!(bool)in_stack_fffffffffffffbc7) {
      testing::Message::Message(&local_250);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c7b5f);
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,900,pcVar3);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::Message::~Message((Message *)0x3c7bc2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c7c17);
    local_269 = local_230 != (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(type *)0x3c7c48);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2a0,(internal *)&local_268,(AssertionResult *)"(nullptr == tx_hex)","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x385,pcVar3);
      testing::internal::AssertHelper::operator=(&local_280,&local_278);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      testing::Message::~Message((Message *)0x3c7d41);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c7db9);
    if (local_230 != (char *)0x0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2b0,
                 "\"02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff04706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac50c300000000000016001445663e592ff613587f0fdd6e74034c5239710dca803801000000000022002064969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b50c3000000000000220020e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000\""
                 ,"tx_hex",
                 "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff04706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac50c300000000000016001445663e592ff613587f0fdd6e74034c5239710dca803801000000000022002064969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b50c3000000000000220020e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000"
                 ,local_230);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
      if (!bVar1) {
        testing::Message::Message(&local_2b8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c7e5d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x387,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
        testing::internal::AssertHelper::~AssertHelper(&local_2c0);
        testing::Message::~Message((Message *)0x3c7eba);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c7f0f);
      CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
    }
    local_14 = CfdFreeTxDataHandle((void *)CONCAT17(in_stack_fffffffffffffc0f,
                                                    in_stack_fffffffffffffc08),
                                   in_stack_fffffffffffffc00);
    local_2d4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               (int *)in_stack_fffffffffffffb30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
    if (!bVar1) {
      testing::Message::Message(&local_2e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c7fdb);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x38c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
      testing::internal::AssertHelper::~AssertHelper(&local_2e8);
      testing::Message::~Message((Message *)0x3c8038);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c808d);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffb6f,
                                                  in_stack_fffffffffffffb68));
  if (local_14 != 0) {
    local_14 = CfdGetLastErrorMessage
                         (in_stack_fffffffffffffbc8,
                          (char **)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
               (int *)in_stack_fffffffffffffb30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd00);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffcf0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c817a);
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x393,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)&stack0xfffffffffffffcf0);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      testing::Message::~Message((Message *)0x3c81d7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c822c);
    in_stack_fffffffffffffb48 = &local_328;
    testing::internal::CmpHelperSTREQ
              ((internal *)in_stack_fffffffffffffb48,"\"\"","str_buffer","",(char *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffb48);
    if (!bVar1) {
      testing::Message::Message(&local_330);
      in_stack_fffffffffffffb40 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3c82c1);
      testing::internal::AssertHelper::AssertHelper
                (&local_338,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x394,in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=(&local_338,&local_330);
      testing::internal::AssertHelper::~AssertHelper(&local_338);
      testing::Message::~Message((Message *)0x3c831e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c8373);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
  }
  local_14 = CfdFreeHandle((void *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
  pAVar4 = (AssertionResult *)&stack0xfffffffffffffcb8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffb48->success_,in_stack_fffffffffffffb40,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
             (int *)pAVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffca8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c8443);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffca0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x39a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffca0,(Message *)&stack0xfffffffffffffca8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffca0);
    testing::Message::~Message((Message *)0x3c849e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c84f3);
  return;
}

Assistant:

TEST(cfdcapi_transaction, SplitTxOut) {
  static const char* const kTxHex = "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000";

  void* handle = nullptr;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == handle));

  void* tx_handle = nullptr;
  ret = CfdInitializeTxDataHandle(
      handle, kCfdNetworkMainnet, kTxHex, &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == tx_handle));
  if (ret == kCfdSuccess) {
    void* split_handle = nullptr;
    ret = CfdCreateSplitTxOutHandle(handle, tx_handle, &split_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((nullptr == split_handle));
    if (ret == kCfdSuccess) {
      // 180000 -> 80000, 50000, 50000
      ret = CfdAddSplitTxOutData(handle, split_handle, 80000, "bc1qvjtfmrxu524qhdevl6yyyasjs7xmnzjlqlu60mrwepact60eyz9s9xjw0c", "", "");
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddSplitTxOutData(handle, split_handle, 50000, "bc1qu2dh70j584vpexwf9dvag5sckqytstpdgp4m50rnsn2ju45pyj4qudazmh", "", "");
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdSplitTxOut(handle, tx_handle, split_handle, 1);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdFreeSplitTxOutHandle(handle, split_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* tx_hex = nullptr;
    ret = CfdFinalizeTransaction(handle, tx_handle, &tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((nullptr == tx_hex));
    if (tx_hex != nullptr) {
      EXPECT_STREQ("02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff04706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac50c300000000000016001445663e592ff613587f0fdd6e74034c5239710dca803801000000000022002064969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b50c3000000000000220020e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000", tx_hex);
      CfdFreeStringBuffer(tx_hex);
    }

    ret = CfdFreeTxDataHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = nullptr;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}